

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O1

void __thiscall
TEST_JUnitOutputTest_withOneTestGroupAndOneTestFileShouldContainAnEmptyPropertiesBlock_Test::
~TEST_JUnitOutputTest_withOneTestGroupAndOneTestFileShouldContainAnEmptyPropertiesBlock_Test
          (TEST_JUnitOutputTest_withOneTestGroupAndOneTestFileShouldContainAnEmptyPropertiesBlock_Test
           *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST(JUnitOutputTest, withOneTestGroupAndOneTestFileShouldContainAnEmptyPropertiesBlock)
{
    testCaseRunner->start()
            .withGroup("groupname").withTest("testname")
            .end();

    outputFile = fileSystem.file("cpputest_groupname.xml");
    STRCMP_EQUAL("<properties>\n", outputFile->line(3));
    STRCMP_EQUAL("</properties>\n", outputFile->line(4));
}